

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

IterateResult __thiscall gl3cts::TransformFeedback::APIErrors::iterate(APIErrors *this)

{
  GLuint *pGVar1;
  RenderContext *pRVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ContextType CVar11;
  GLenum GVar12;
  GLuint GVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  GLchar *pGVar14;
  char *description;
  bool bVar15;
  undefined1 auVar16 [16];
  Functions *gl;
  
  iVar10 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar10);
  CVar11.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar11,(ApiType)0x103);
  CVar11.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(CVar11,(ApiType)0x104);
  CVar11.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar5 = glu::contextSupports(CVar11,(ApiType)0x124);
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_EXT_transform_feedback");
  bVar7 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_transform_feedback2");
  bVar8 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_transform_feedback3");
  bVar9 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_transform_feedback_instanced");
  if (bVar6) {
    pRVar2 = this->m_context->m_renderCtx;
    iVar10 = (*pRVar2->_vptr_RenderContext[7])(pRVar2,"glBindBufferOffsetEXT");
    this->m_glBindBufferOffsetEXT =
         (BindBufferOffsetEXT_ProcAddress)CONCAT44(extraout_var_00,iVar10);
    pRVar2 = this->m_context->m_renderCtx;
    iVar10 = (*pRVar2->_vptr_RenderContext[7])(pRVar2,"glGetIntegerIndexedvEXT");
    this->m_glGetIntegerIndexedvEXT =
         (GetIntegerIndexedvEXT_ProcAddress)CONCAT44(extraout_var_01,iVar10);
    pRVar2 = this->m_context->m_renderCtx;
    iVar10 = (*pRVar2->_vptr_RenderContext[7])(pRVar2,"glGetBooleanIndexedvEXT");
    this->m_glGetBooleanIndexedvEXT =
         (GetBooleanIndexedvEXT_ProcAddress)CONCAT44(extraout_var_02,iVar10);
  }
  if (bVar7 || bVar4) {
    (*gl->genTransformFeedbacks)(1,&this->m_transform_feedback_object_0);
    GVar12 = (*gl->getError)();
    glu::checkError(GVar12,"glGenTransformFeedbacks call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xa2);
  }
  if (bVar4 || bVar8) {
    (*gl->genQueries)(1,&this->m_query_object);
    GVar12 = (*gl->getError)();
    glu::checkError(GVar12,"glGenQueries call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xaa);
  }
  if (bVar5 || bVar9) {
    (*gl->genTransformFeedbacks)(1,&this->m_transform_feedback_object_1);
    GVar12 = (*gl->getError)();
    glu::checkError(GVar12,"glGenTransformFeedbacks call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xb2);
  }
  pGVar1 = &this->m_vertex_array_object;
  (*gl->genVertexArrays)(1,pGVar1);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xbe);
  (*gl->bindVertexArray)(*pGVar1);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xc1);
  (*gl->genBuffers)(1,&this->m_buffer_0);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xc5);
  (*gl->bindBuffer)(0x8c8e,this->m_buffer_0);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,200);
  (*gl->bufferData)(0x8c8e,0x10,(void *)0x0,0x88e4);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xcb);
  (*gl->genBuffers)(1,&this->m_buffer_1);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xce);
  (*gl->bindBuffer)(0x8892,this->m_buffer_1);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xd1);
  (*gl->bufferData)(0x8892,8,m_buffer_1_data,0x88e4);
  GVar12 = (*gl->getError)();
  glu::checkError(GVar12,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xd4);
  GVar13 = Utilities::buildProgram
                     (gl,this->m_context->m_testCtx->m_log,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0
                      ,s_vertex_shader_with_input_output,s_fragment_shader,&m_varying_name,1,0x8c8c,
                      false,(GLint *)0x0);
  this->m_program_id_with_input_output = GVar13;
  GVar13 = Utilities::buildProgram
                     (gl,this->m_context->m_testCtx->m_log,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0
                      ,s_vertex_shader_with_output,s_fragment_shader,&m_varying_name,1,0x8c8c,true,
                      (GLint *)0x0);
  this->m_program_id_with_output = GVar13;
  GVar13 = Utilities::buildProgram
                     (gl,this->m_context->m_testCtx->m_log,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0
                      ,s_vertex_shader_without_output,s_fragment_shader,(GLchar **)0x0,0,0x8c8d,
                      false,(GLint *)0x0);
  this->m_program_id_without_output = GVar13;
  GVar13 = Utilities::buildProgram
                     (gl,this->m_context->m_testCtx->m_log,m_geometry_shader,(GLchar *)0x0,
                      (GLchar *)0x0,s_vertex_shader_without_output,s_fragment_shader,&m_varying_name
                      ,1,0x8c8c,false,(GLint *)0x0);
  this->m_program_id_with_geometry_shader = GVar13;
  pGVar14 = m_tessellation_control_shader;
  GVar13 = Utilities::buildProgram
                     (gl,this->m_context->m_testCtx->m_log,(GLchar *)0x0,
                      m_tessellation_control_shader,m_tessellation_evaluation_shader,
                      s_vertex_shader_without_output,s_fragment_shader,&m_varying_name,1,0x8c8c,
                      false,(GLint *)0x0);
  this->m_program_id_with_tessellation_shaders = GVar13;
  auVar16._0_4_ = -(uint)(this->m_program_id_with_input_output == 0);
  auVar16._4_4_ = -(uint)(this->m_program_id_with_output == 0);
  auVar16._8_4_ = -(uint)(this->m_program_id_without_output == 0);
  auVar16._12_4_ = -(uint)(this->m_program_id_with_geometry_shader == 0);
  iVar10 = movmskps((int)pGVar14,auVar16);
  bVar15 = iVar10 == 0 && GVar13 != 0;
  if (bVar3 || bVar6) {
    if (iVar10 == 0 && GVar13 != 0) {
      bVar15 = testExtension1(this);
    }
    else {
      bVar15 = false;
    }
  }
  if (bVar7 || bVar4) {
    if (bVar15 == false) {
      bVar15 = false;
    }
    else {
      bVar15 = testExtension2(this);
    }
  }
  if (bVar4 || bVar8) {
    if (bVar15 == false) {
      bVar15 = false;
    }
    else {
      bVar15 = testExtension3(this);
    }
  }
  if (bVar5 || bVar9) {
    if (bVar15 == false) {
      bVar15 = false;
    }
    else {
      bVar15 = testInstanced(this);
    }
  }
  if (*pGVar1 != 0) {
    (*gl->deleteVertexArrays)(1,pGVar1);
    *pGVar1 = 0;
  }
  if (this->m_buffer_0 != 0) {
    (*gl->deleteBuffers)(1,&this->m_buffer_0);
    this->m_buffer_0 = 0;
  }
  if (this->m_buffer_1 != 0) {
    (*gl->deleteBuffers)(1,&this->m_buffer_1);
    this->m_buffer_1 = 0;
  }
  if (this->m_transform_feedback_object_0 != 0) {
    (*gl->deleteTransformFeedbacks)(1,&this->m_transform_feedback_object_0);
    this->m_transform_feedback_object_0 = 0;
  }
  if (this->m_transform_feedback_object_1 != 0) {
    (*gl->deleteTransformFeedbacks)(1,&this->m_transform_feedback_object_1);
    this->m_transform_feedback_object_1 = 0;
  }
  if (this->m_query_object != 0) {
    (*gl->deleteQueries)(1,&this->m_query_object);
    this->m_query_object = 0;
  }
  if (this->m_program_id_with_input_output != 0) {
    (*gl->deleteProgram)(this->m_program_id_with_input_output);
    this->m_program_id_with_input_output = 0;
  }
  if (this->m_program_id_with_output != 0) {
    (*gl->deleteProgram)(this->m_program_id_with_output);
    this->m_program_id_with_output = 0;
  }
  if (this->m_program_id_without_output != 0) {
    (*gl->deleteProgram)(this->m_program_id_without_output);
    this->m_program_id_without_output = 0;
  }
  if (this->m_program_id_with_geometry_shader != 0) {
    (*gl->deleteProgram)(this->m_program_id_with_geometry_shader);
    this->m_program_id_with_geometry_shader = 0;
  }
  if (this->m_program_id_with_tessellation_shaders != 0) {
    (*gl->deleteProgram)(this->m_program_id_with_tessellation_shaders);
    this->m_program_id_with_tessellation_shaders = 0;
  }
  if (bVar15 == false) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar15 == false),
             description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::APIErrors::iterate(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initializations. */
	bool is_at_least_gl_30 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)));
	bool is_at_least_gl_40 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_at_least_gl_42 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 2)));

	bool is_ext_tf_1		 = m_context.getContextInfo().isExtensionSupported("GL_EXT_transform_feedback");
	bool is_arb_tf_2		 = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback2");
	bool is_arb_tf_3		 = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback3");
	bool is_arb_tf_instanced = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback_instanced");

	if (is_ext_tf_1)
	{
		/* Extension query. */
		m_glBindBufferOffsetEXT =
			(BindBufferOffsetEXT_ProcAddress)m_context.getRenderContext().getProcAddress("glBindBufferOffsetEXT");
		m_glGetIntegerIndexedvEXT =
			(GetIntegerIndexedvEXT_ProcAddress)m_context.getRenderContext().getProcAddress("glGetIntegerIndexedvEXT");
		m_glGetBooleanIndexedvEXT =
			(GetBooleanIndexedvEXT_ProcAddress)m_context.getRenderContext().getProcAddress("glGetBooleanIndexedvEXT");
	}

	if (is_at_least_gl_40 || is_arb_tf_2)
	{
		/* Create transform feedback objects. */
		gl.genTransformFeedbacks(1, &m_transform_feedback_object_0);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");
	}

	if (is_at_least_gl_40 || is_arb_tf_3)
	{
		/* Create query object. */
		gl.genQueries(1, &m_query_object);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries call failed.");
	}

	if (is_at_least_gl_42 || is_arb_tf_instanced)
	{
		/* Create transform feedback objects. */
		gl.genTransformFeedbacks(1, &m_transform_feedback_object_1);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");
	}

	/* Default result. */
	bool is_ok		= true;
	bool test_error = false;

	/* Entities setup. */
	try
	{
		/* VAO setup. */
		gl.genVertexArrays(1, &m_vertex_array_object);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

		gl.bindVertexArray(m_vertex_array_object);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

		/* Buffer setup. */
		gl.genBuffers(1, &m_buffer_0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffer_0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, NULL, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

		gl.genBuffers(1, &m_buffer_1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

		gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer_1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.bufferData(GL_ARRAY_BUFFER, m_buffer_1_size, m_buffer_1_data, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

		/* Programs setup. */

		m_program_id_with_input_output = gl3cts::TransformFeedback::Utilities::buildProgram(
			gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_with_input_output,
			s_fragment_shader, &m_varying_name, 1, GL_INTERLEAVED_ATTRIBS);

		m_program_id_with_output = gl3cts::TransformFeedback::Utilities::buildProgram(
			gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_with_output, s_fragment_shader,
			&m_varying_name, 1, GL_INTERLEAVED_ATTRIBS, true);

		m_program_id_without_output = gl3cts::TransformFeedback::Utilities::buildProgram(
			gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_without_output,
			s_fragment_shader, NULL, 0, GL_SEPARATE_ATTRIBS);

		m_program_id_with_geometry_shader = gl3cts::TransformFeedback::Utilities::buildProgram(
			gl, m_context.getTestContext().getLog(), m_geometry_shader, NULL, NULL, s_vertex_shader_without_output,
			s_fragment_shader, &m_varying_name, 1, GL_INTERLEAVED_ATTRIBS);

		m_program_id_with_tessellation_shaders = gl3cts::TransformFeedback::Utilities::buildProgram(
			gl, m_context.getTestContext().getLog(), NULL, m_tessellation_control_shader,
			m_tessellation_evaluation_shader, s_vertex_shader_without_output, s_fragment_shader, &m_varying_name, 1,
			GL_INTERLEAVED_ATTRIBS);

		is_ok = is_ok && m_program_id_with_input_output && m_program_id_with_output && m_program_id_without_output &&
				m_program_id_with_geometry_shader && m_program_id_with_tessellation_shaders;
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Iterating tests. */
	try
	{
		if (is_at_least_gl_30 || is_ext_tf_1)
		{
			is_ok = is_ok && testExtension1();
		}

		if (is_at_least_gl_40 || is_arb_tf_2)
		{
			is_ok = is_ok && testExtension2();
		}

		if (is_at_least_gl_40 || is_arb_tf_3)
		{
			is_ok = is_ok && testExtension3();
		}

		if (is_at_least_gl_42 || is_arb_tf_instanced)
		{
			is_ok = is_ok && testInstanced();
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Deinitialization. */
	if (m_vertex_array_object)
	{
		gl.deleteVertexArrays(1, &m_vertex_array_object);

		m_vertex_array_object = 0;
	}

	if (m_buffer_0)
	{
		gl.deleteBuffers(1, &m_buffer_0); // silently unbinds

		m_buffer_0 = 0;
	}

	if (m_buffer_1)
	{
		gl.deleteBuffers(1, &m_buffer_1); // silently unbinds

		m_buffer_1 = 0;
	}

	if (m_transform_feedback_object_0)
	{
		gl.deleteTransformFeedbacks(1, &m_transform_feedback_object_0);

		m_transform_feedback_object_0 = 0;
	}

	if (m_transform_feedback_object_1)
	{
		gl.deleteTransformFeedbacks(1, &m_transform_feedback_object_1);

		m_transform_feedback_object_1 = 0;
	}

	if (m_query_object)
	{
		gl.deleteQueries(1, &m_query_object);

		m_query_object = 0;
	}

	if (m_program_id_with_input_output)
	{
		gl.deleteProgram(m_program_id_with_input_output);

		m_program_id_with_input_output = 0;
	}

	if (m_program_id_with_output)
	{
		gl.deleteProgram(m_program_id_with_output);

		m_program_id_with_output = 0;
	}

	if (m_program_id_without_output)
	{
		gl.deleteProgram(m_program_id_without_output);

		m_program_id_without_output = 0;
	}

	if (m_program_id_with_geometry_shader)
	{
		gl.deleteProgram(m_program_id_with_geometry_shader);

		m_program_id_with_geometry_shader = 0;
	}

	if (m_program_id_with_tessellation_shaders)
	{
		gl.deleteProgram(m_program_id_with_tessellation_shaders);

		m_program_id_with_tessellation_shaders = 0;
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}